

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_resetCStream(ZSTD_CStream *zcs,unsigned_long_long pledgedSrcSize)

{
  ZSTD_CDict *cdict;
  uint uVar1;
  size_t sVar2;
  long lVar3;
  ZSTD_CCtx_params *pZVar4;
  ZSTD_CCtx_params *pZVar5;
  undefined8 *puVar6;
  ulong srcSizeHint;
  byte bVar7;
  ZSTD_CCtx_params params;
  ZSTD_CCtx_params in_stack_fffffffffffffeb8;
  ZSTD_compressionParameters local_bc;
  ZSTD_CCtx_params local_a0;
  
  bVar7 = 0;
  pZVar4 = &zcs->requestedParams;
  pZVar5 = &local_a0;
  for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = (pZVar4->cParams).windowLog;
    pZVar5->format = pZVar4->format;
    (pZVar5->cParams).windowLog = uVar1;
    pZVar4 = (ZSTD_CCtx_params *)&(pZVar4->cParams).chainLog;
    pZVar5 = (ZSTD_CCtx_params *)&(pZVar5->cParams).chainLog;
  }
  srcSizeHint = -(ulong)(pledgedSrcSize == 0) | pledgedSrcSize;
  local_a0.fParams.contentSizeFlag = 1;
  ZSTD_getCParamsFromCCtxParams(&local_bc,&local_a0,srcSizeHint,0);
  local_a0.cParams.targetLength = local_bc.targetLength;
  local_a0.cParams.strategy = local_bc.strategy;
  local_a0.cParams.windowLog = local_bc.windowLog;
  local_a0.cParams.chainLog = local_bc.chainLog;
  cdict = zcs->cdict;
  pZVar4 = &local_a0;
  puVar6 = (undefined8 *)&stack0xfffffffffffffeb8;
  for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar6 = *(undefined8 *)pZVar4;
    pZVar4 = (ZSTD_CCtx_params *)((long)pZVar4 + (ulong)bVar7 * -0x10 + 8);
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  sVar2 = ZSTD_compressBegin_internal
                    (zcs,(void *)0x0,0,ZSTD_dct_auto,ZSTD_dtlm_fast,cdict,in_stack_fffffffffffffeb8,
                     srcSizeHint,ZSTDb_buffered);
  if (sVar2 < 0xffffffffffffff89) {
    zcs->inToCompress = 0;
    zcs->inBuffPos = 0;
    zcs->inBuffTarget = (ulong)(zcs->blockSize == srcSizeHint) + zcs->blockSize;
    zcs->outBuffContentSize = 0;
    zcs->outBuffFlushedSize = 0;
    zcs->streamStage = zcss_load;
    zcs->frameEnded = 0;
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t ZSTD_resetCStream(ZSTD_CStream* zcs, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params params = zcs->requestedParams;
    DEBUGLOG(4, "ZSTD_resetCStream: pledgedSrcSize = %u", (U32)pledgedSrcSize);
    if (pledgedSrcSize==0) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;
    params.fParams.contentSizeFlag = 1;
    params.cParams = ZSTD_getCParamsFromCCtxParams(&params, pledgedSrcSize, 0);
    return ZSTD_resetCStream_internal(zcs, NULL, 0, ZSTD_dct_auto, zcs->cdict, params, pledgedSrcSize);
}